

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.hpp
# Opt level: O0

void __thiscall xe::xml::Writer::Attribute::Attribute(Attribute *this,char *name_,char *value_)

{
  char *__s;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  char *local_20;
  char *value__local;
  char *name__local;
  Attribute *this_local;
  
  local_20 = value_;
  value__local = name_;
  name__local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_21);
  std::allocator<char>::~allocator(&local_21);
  __s = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->value,__s,local_35);
  std::allocator<char>::~allocator(local_35);
  return;
}

Assistant:

Attribute (const char* name_, const char* value_) : name(name_), value(value_) {}